

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>,_true>
__thiscall
duckdb::JoinFilterPushdownInfo::GetLocalState
          (JoinFilterPushdownInfo *this,JoinFilterGlobalState *gstate)

{
  pointer puVar1;
  type gstate_00;
  LocalUngroupedAggregateState *this_00;
  __uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  *this_01;
  unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>
  *in_RDX;
  
  puVar1 = (pointer)operator_new(8);
  *puVar1 = 0;
  (this->join_condition).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar1;
  gstate_00 = unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>
              ::operator*(in_RDX);
  this_00 = (LocalUngroupedAggregateState *)operator_new(0x60);
  LocalUngroupedAggregateState::LocalUngroupedAggregateState(this_00,gstate_00);
  this_01 = (__uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
             *)unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>,_true>
               ::operator->((unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>,_true>
                             *)this);
  ::std::
  __uniq_ptr_impl<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>_>
  ::reset(this_01,this_00);
  return (unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
          )(unique_ptr<duckdb::JoinFilterLocalState,_std::default_delete<duckdb::JoinFilterLocalState>_>
            )this;
}

Assistant:

unique_ptr<JoinFilterLocalState> JoinFilterPushdownInfo::GetLocalState(JoinFilterGlobalState &gstate) const {
	auto result = make_uniq<JoinFilterLocalState>();
	result->local_aggregate_state = make_uniq<LocalUngroupedAggregateState>(*gstate.global_aggregate_state);
	return result;
}